

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_cheat.cpp
# Opt level: O2

void cht_DoCheat(player_t *player,int cheat)

{
  ActorFlags2 *pAVar1;
  double dVar2;
  uint uVar3;
  undefined1 *puVar4;
  uint uVar5;
  PClassPlayerPawn *morphclass;
  AInventory *pAVar6;
  char *pcVar7;
  APlayerPawn *pAVar8;
  VMFrameStack *this;
  PClassActor *pPVar9;
  AWeapon *pAVar10;
  AActor *pAVar11;
  FState *state;
  byte bVar12;
  BYTE *pBVar13;
  APlayerPawn *pAVar14;
  int iVar15;
  AWeapon *weap;
  char *pcVar16;
  bool bVar17;
  int oldpieces;
  FName local_a8;
  FName local_a4;
  FName local_a0;
  FName local_9c;
  VMValue params [1];
  undefined8 local_88;
  undefined1 local_80 [16];
  DAngle local_70;
  VMReturn ret;
  char msgbuild [32];
  
  iVar15 = deh.GodHealth;
  pcVar16 = "";
  switch(cheat) {
  case 0:
    uVar5 = player->cheats;
    goto LAB_003b5a09;
  case 1:
    uVar5 = player->cheats;
    player->cheats = uVar5 ^ 1;
    if ((uVar5 & 1) == 0) {
      pcVar16 = "STSTR_NCON";
    }
    else {
      pcVar16 = "STSTR_NCOFF";
    }
    goto LAB_003b5c3e;
  case 2:
    uVar5 = player->cheats;
    player->cheats = uVar5 ^ 8;
    pcVar16 = "notarget OFF";
    if ((uVar5 & 8) == 0) {
      pcVar16 = "notarget ON";
    }
    break;
  case 3:
    if ((player->mo == (APlayerPawn *)0x0) || (player->health < 0)) break;
    pPVar9 = PClass::FindActor("Chainsaw");
    pAVar6 = AActor::FindInventory(&player->mo->super_AActor,pPVar9,false);
    if (pAVar6 == (AInventory *)0x0) {
      AActor::GiveInventoryType(&player->mo->super_AActor,pPVar9);
    }
    pcVar16 = "STSTR_CHOPPERS";
    goto LAB_003b5c3e;
  case 4:
    cht_Give(player,"backpack",1);
    cht_Give(player,"weapons",1);
    cht_Give(player,"ammo",1);
    cht_Give(player,"keys",1);
    cht_Give(player,"armor",1);
    pcVar16 = "STSTR_KFAADDED";
    goto LAB_003b5c3e;
  case 5:
    cht_Give(player,"backpack",1);
    cht_Give(player,"weapons",1);
    cht_Give(player,"ammo",1);
    cht_Give(player,"armor",1);
    pcVar16 = "STSTR_FAADDED";
    goto LAB_003b5c3e;
  case 6:
  case 7:
  case 8:
  case 9:
  case 10:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0xe:
    uVar5 = cheat - 6;
    if (uVar5 == 4) {
      level.flags2._0_1_ = (byte)level.flags2 ^ 2;
    }
    else {
      pAVar8 = player->mo;
      if ((pAVar8 != (APlayerPawn *)0x0) && (-1 < player->health)) {
        pcVar16 = cht_DoCheat::BeholdPowers[uVar5];
        pPVar9 = PClass::FindActor(pcVar16);
        pAVar6 = AActor::FindInventory(&pAVar8->super_AActor,pPVar9,false);
        if (pAVar6 == (AInventory *)0x0) {
          if (uVar5 == 0) {
            cht_Give(player,"InvulnerabilitySphere",1);
          }
          else {
            cht_Give(player,pcVar16,1);
            if (cheat == 7) {
              P_GiveBody(&player->mo->super_AActor,-100,0);
            }
          }
        }
        else {
          (*(pAVar6->super_AActor).super_DThinker.super_DObject._vptr_DObject[4])(pAVar6);
        }
      }
    }
    pcVar16 = "STSTR_BEHOLDX";
    goto LAB_003b5c3e;
  case 0xf:
    cht_Give(player,"MedPatch",1);
    cht_Give(player,"MedicalKit",1);
    pcVar16 = "SurgeryKit";
    goto LAB_003b5c2b;
  case 0x10:
    pcVar16 = "AmmoSatchel";
    goto LAB_003b5c2b;
  case 0x11:
    cht_Give(player,"UpgradeStamina",10);
    pcVar16 = "UpgradeAccuracy";
LAB_003b5c2b:
    cht_Give(player,pcVar16,1);
    pcVar16 = "TXT_GOTSTUFF";
    goto LAB_003b5c3e;
  case 0x12:
    uVar5 = player->cheats;
    if (((uVar5 & 2) == 0) && (player->playerstate == '\0')) {
      if (player->mo != (APlayerPawn *)0x0) {
        (player->mo->super_AActor).health = deh.GodHealth;
      }
      player->health = iVar15;
    }
LAB_003b5a09:
    player->cheats = uVar5 ^ 2;
    pcVar16 = "STSTR_DQDOFF";
    if ((uVar5 & 2) == 0) {
      pcVar16 = "STSTR_DQDON";
    }
LAB_003b5e56:
    pcVar16 = FStringTable::operator()(&GStrings,pcVar16);
    ST_SetNeedRefresh();
    break;
  case 0x13:
    uVar5 = P_Massacre();
    pBVar13 = "s";
    if (uVar5 == 1) {
      pBVar13 = "";
    }
    pcVar16 = msgbuild;
    mysnprintf(pcVar16,0x20,"%d Monster%s Killed",(ulong)uVar5,pBVar13);
    break;
  case 0x14:
    uVar5 = player->cheats;
    player->cheats = uVar5 ^ 0x20;
    pcVar16 = "chasecam OFF";
    if ((uVar5 & 0x20) == 0) {
      pcVar16 = "chasecam ON";
    }
    R_ResetViewInterpolation();
    break;
  case 0x15:
    pAVar8 = player->mo;
    if (pAVar8 == (APlayerPawn *)0x0) break;
    uVar5 = (pAVar8->super_AActor).flags.Value;
    uVar3 = (pAVar8->super_AActor).flags7.Value;
    (pAVar8->super_AActor).flags7.Value = uVar3 ^ 0x20000;
    if ((uVar3 >> 0x11 & 1) == 0) {
      (pAVar8->super_AActor).flags.Value = uVar5 | 0x200;
      pAVar1 = &(pAVar8->super_AActor).flags2;
      *(byte *)&pAVar1->Value = (byte)pAVar1->Value | 0x10;
      pcVar16 = "TXT_LIGHTER";
    }
    else {
      (pAVar8->super_AActor).flags.Value = uVar5 & 0xfffffdff;
      pAVar1 = &(pAVar8->super_AActor).flags2;
      *(byte *)&pAVar1->Value = (byte)pAVar1->Value & 0xef;
      pcVar16 = "TXT_GRAVITY";
    }
    goto LAB_003b5c3e;
  case 0x16:
    morphclass = (PClassPlayerPawn *)
                 PClass::FindClass((gameinfo.gametype != GAME_Heretic) + NAME_ChickenPlayer);
    pcVar16 = cht_Morph(player,morphclass,true);
    break;
  case 0x17:
    if ((player->mo == (APlayerPawn *)0x0) || (player->health < 0)) break;
    pAVar6 = AActor::FindInventory
                       (&player->mo->super_AActor,
                        (PClassActor *)APowerWeaponLevel2::RegistrationInfo.MyClass,true);
    if (pAVar6 == (AInventory *)0x0) {
      AActor::GiveInventoryType
                (&player->mo->super_AActor,
                 (PClassActor *)APowerWeaponLevel2::RegistrationInfo.MyClass);
      pcVar16 = "TXT_CHEATPOWERON";
    }
    else {
      (*(pAVar6->super_AActor).super_DThinker.super_DObject._vptr_DObject[4])(pAVar6);
      pcVar16 = "TXT_CHEATPOWEROFF";
    }
    goto LAB_003b5c3e;
  case 0x18:
    if ((player->mo == (APlayerPawn *)0x0) || (player->playerstate != '\0')) break;
    pAVar11 = AActor::GetDefault(&player->mo->super_AActor);
    iVar15 = pAVar11->health;
    (player->mo->super_AActor).health = iVar15;
    player->health = iVar15;
    pcVar16 = "TXT_CHEATHEALTH";
    goto LAB_003b5c3e;
  case 0x19:
    cht_Give(player,"keys",1);
    pcVar16 = "TXT_CHEATKEYS";
    goto LAB_003b5c3e;
  case 0x1a:
    if (player->morphTics != 0) {
      return;
    }
    pAVar8 = player->mo;
    if (pAVar8 == (APlayerPawn *)0x0) {
      return;
    }
    if ((pAVar8->super_AActor).health < 1) {
      return;
    }
    while (pAVar14 = pAVar8, pAVar8 = (APlayerPawn *)(pAVar14->super_AActor).Inventory.field_0.p,
          pAVar8 != (APlayerPawn *)0x0) {
      bVar17 = DObject::IsKindOf((DObject *)pAVar8,AWeapon::RegistrationInfo.MyClass);
      if ((bVar17) &&
         (((*(undefined1 *)((long)((FSoundIDNoInit *)&pAVar8->FallingScreamMaxSpeed + 1) + 1) & 2)
           == 0 || (pAVar8->ViewHeight != 0.0)))) {
        (*(pAVar8->super_AActor).super_DThinker.super_DObject._vptr_DObject[4])(pAVar8);
        pAVar8 = pAVar14;
      }
    }
    pcVar16 = "TXT_CHEATIDKFA";
    goto LAB_003b5c3e;
  case 0x1b:
    cht_Suicide(player);
    pcVar16 = "TXT_CHEATIDDQD";
    goto LAB_003b5c3e;
  case 0x1c:
    iVar15 = 0x19;
    while (bVar17 = iVar15 != 0, iVar15 = iVar15 + -1, bVar17) {
      cht_Give(player,"artifacts",1);
    }
    goto LAB_003b5a6b;
  case 0x1d:
    cht_Give(player,"puzzlepieces",1);
LAB_003b5a6b:
    pcVar16 = "TXT_CHEATARTIFACTS3";
    goto LAB_003b5c3e;
  case 0x1e:
    pAVar8 = player->mo;
    if (pAVar8 != (APlayerPawn *)0x0) {
      if (deathmatch.Value == 0) {
        local_80._0_8_ = (pAVar8->super_AActor).Angles.Yaw.Degrees;
        local_88 = 0;
        local_70.Degrees = (double)local_80._0_8_;
        P_AimLineAttack((AActor *)(local_80 + 8),(DAngle *)pAVar8,8192.0,
                        (FTranslatedLineTarget *)local_80,(DAngle *)0x0,(int)&local_88,(AActor *)0x0
                        ,(AActor *)0x0);
        local_9c.Index = 0xcf;
        local_a0.Index = 0x40;
        P_LineAttack(&pAVar8->super_AActor,&local_70,8192.0,(DAngle *)(local_80 + 8),1000000,
                     &local_9c,&local_a0,0,(FTranslatedLineTarget *)0x0,(int *)0x0);
      }
      break;
    }
    pcVar7 = "What do you want to kill outside of a game?\n";
    goto LAB_003b5faf;
  case 0x1f:
    uVar5 = player->cheats;
    player->cheats = uVar5 ^ 0x400;
    pcVar16 = "No more ogre armor";
    if ((uVar5 >> 10 & 1) == 0) {
      pcVar16 = "\"Quake with fear!\"";
    }
    break;
  case 0x20:
    uVar5 = player->cheats;
    player->cheats = uVar5 ^ 4;
    if ((uVar5 & 4) == 0) {
      pcVar16 = "TXT_LEADBOOTSON";
    }
    else {
      pcVar16 = "TXT_LEADBOOTSOFF";
    }
    goto LAB_003b5c3e;
  case 0x21:
    cht_Give(player,"HealthTraining",1);
    pcVar16 = "TXT_MIDASTOUCH";
    goto LAB_003b5c3e;
  case 0x22:
    pAVar8 = player->mo;
    if ((pAVar8 != (APlayerPawn *)0x0) && (-1 < player->health)) {
      if (cht_DoCheat::gsp == (VMFunction *)0x0) {
        local_a4.Index = 0x5b;
        local_a8.Index = 0x5d;
        cht_DoCheat::gsp = PClass::FindFunction(&local_a4,&local_a8);
        if (cht_DoCheat::gsp == (VMFunction *)0x0) break;
        pAVar8 = player->mo;
      }
      oldpieces = 1;
      params[0].field_0.field_3.Type = '\x03';
      ret.Location = &oldpieces;
      ret.TagOfs = 0;
      ret.RegType = '\0';
      params[0].field_0._0_8_ = pAVar8;
      params[0].field_0._8_4_ = oldpieces;
      this = (VMFrameStack *)_ZTW13GlobalVMStack();
      VMFrameStack::Call(this,cht_DoCheat::gsp,params,1,&ret,1,(VMException **)0x0);
      pAVar8 = player->mo;
      pPVar9 = PClass::FindActor(NAME_Sigil);
      pAVar10 = (AWeapon *)AActor::FindInventory(&pAVar8->super_AActor,pPVar9,false);
      if (pAVar10 != (AWeapon *)0x0) {
        if (oldpieces == 5) {
          (*(pAVar10->super_AStateProvider).super_AInventory.super_AActor.super_DThinker.
            super_DObject._vptr_DObject[4])(pAVar10);
        }
        else {
          player->PendingWeapon = pAVar10;
        }
      }
      VMValue::~VMValue(params);
    }
    break;
  case 0x23:
    if ((player->playerstate == '\0') || (player->mo == (APlayerPawn *)0x0)) break;
    bVar17 = DObject::IsKindOf((DObject *)player->mo,APlayerChunk::RegistrationInfo.MyClass);
    if (!bVar17) {
      player->playerstate = '\0';
      pAVar11 = AActor::GetDefault(&player->mo->super_AActor);
      iVar15 = pAVar11->health;
      pAVar8 = player->mo;
      (pAVar8->super_AActor).health = iVar15;
      player->health = iVar15;
      pAVar11 = AActor::GetDefault(&pAVar8->super_AActor);
      player->viewheight = (double)pAVar11[1].sprev;
      pAVar11 = AActor::GetDefault(&player->mo->super_AActor);
      pAVar8 = player->mo;
      (pAVar8->super_AActor).flags.Value = (pAVar11->flags).Value;
      pAVar11 = AActor::GetDefault(&pAVar8->super_AActor);
      pAVar8 = player->mo;
      (pAVar8->super_AActor).flags2.Value = (pAVar11->flags2).Value;
      pAVar11 = AActor::GetDefault(&pAVar8->super_AActor);
      pAVar8 = player->mo;
      (pAVar8->super_AActor).flags3.Value = (pAVar11->flags3).Value;
      pAVar11 = AActor::GetDefault(&pAVar8->super_AActor);
      pAVar8 = player->mo;
      (pAVar8->super_AActor).flags4.Value = (pAVar11->flags4).Value;
      pAVar11 = AActor::GetDefault(&pAVar8->super_AActor);
      pAVar8 = player->mo;
      (pAVar8->super_AActor).flags5.Value = (pAVar11->flags5).Value;
      pAVar11 = AActor::GetDefault(&pAVar8->super_AActor);
      pAVar8 = player->mo;
      (pAVar8->super_AActor).flags6.Value = (pAVar11->flags6).Value;
      pAVar11 = AActor::GetDefault(&pAVar8->super_AActor);
      pAVar8 = player->mo;
      (pAVar8->super_AActor).flags7.Value = (pAVar11->flags7).Value;
      puVar4 = (undefined1 *)((long)&(pAVar8->super_AActor).renderflags.Value + 1);
      *puVar4 = *puVar4 & 0x7f;
      pAVar11 = AActor::GetDefault(&pAVar8->super_AActor);
      pAVar8 = player->mo;
      (pAVar8->super_AActor).Height = pAVar11->Height;
      pAVar11 = AActor::GetDefault(&pAVar8->super_AActor);
      pAVar8 = player->mo;
      (pAVar8->super_AActor).radius = pAVar11->radius;
      (pAVar8->super_AActor).special1 = 0;
      AActor::SetState(&pAVar8->super_AActor,(pAVar8->super_AActor).SpawnState,false);
      pAVar8 = player->mo;
      if (((pAVar8->super_AActor).flags2.Value & 0x10000) == 0) {
        (pAVar8->super_AActor).Translation =
             (uint)((long)&player[-0x916e].morphTics / 0x2a0) & 0xff | 0x10000;
      }
      (pAVar8->super_AActor).DamageType.super_FName.Index = 0;
      if (player->ReadyWeapon != (AWeapon *)0x0) {
        state = AWeapon::GetUpState(player->ReadyWeapon);
        P_SetPsprite(player,PSP_WEAPON,state,false);
      }
      if (player->morphTics != 0) {
        P_UndoPlayerMorph(player,player,0,false);
      }
      break;
    }
    pcVar7 = "Unable to resurrect. Player is no longer connected to its body.\n";
LAB_003b5faf:
    Printf(pcVar7);
    break;
  case 0x24:
    player->cheats = player->cheats & 0xffffefbf;
    pcVar16 = "Frozen player properties turned off";
    break;
  case 0x25:
    bVar12 = bglobal._16_1_ ^ 2;
    if (((bVar12 >> 1 ^ bglobal._16_1_) & 1) == 0) {
      pcVar16 = "TXT_FREEZEOFF";
      bglobal._16_1_ = bVar12;
    }
    else {
      pcVar16 = "TXT_FREEZEON";
      bglobal._16_1_ = bVar12;
    }
    goto LAB_003b5c3e;
  case 0x26:
    cht_Give(player,"ArtiInvulnerability",1);
    pcVar16 = "Valador\'s Ring of Invunerability";
    break;
  case 0x27:
    cht_Give(player,"ArtiInvisibility",1);
    pcVar16 = "Shadowsphere";
    break;
  case 0x28:
    cht_Give(player,"ArtiHealth",1);
    pcVar16 = "Quartz Flask";
    break;
  case 0x29:
    cht_Give(player,"ArtiSuperHealth",1);
    pcVar16 = "Mystic Urn";
    break;
  case 0x2a:
    cht_Give(player,"ArtiTomeOfPower",1);
    pcVar16 = "Tyketto\'s Tome of Power";
    break;
  case 0x2b:
    cht_Give(player,"ArtiTorch",1);
    pcVar16 = "Torch";
    break;
  case 0x2c:
    cht_Give(player,"ArtiTimeBomb",1);
    pcVar16 = "Delmintalintar\'s Time Bomb of the Ancients";
    break;
  case 0x2d:
    cht_Give(player,"ArtiEgg",1);
    pcVar16 = "Torpol\'s Morph Ovum";
    break;
  case 0x2e:
    cht_Give(player,"ArtiFly",1);
    pcVar16 = "Inhilicon\'s Wings of Wrath";
    break;
  case 0x2f:
    cht_Give(player,"ArtiTeleport",1);
    pcVar16 = "Darchala\'s Chaos Device";
    break;
  case 0x30:
    iVar15 = 0x10;
    pcVar16 = "All artifacts!";
    while (bVar17 = iVar15 != 0, iVar15 = iVar15 + -1, bVar17) {
      cht_Give(player,"artifacts",1);
    }
    break;
  case 0x31:
    uVar5 = player->cheats;
    player->cheats = uVar5 ^ 0x8000000;
    if ((uVar5 >> 0x1b & 1) == 0) {
      pcVar16 = "TXT_BUDDHAON";
    }
    else {
      pcVar16 = "TXT_BUDDHAOFF";
    }
    goto LAB_003b5c3e;
  case 0x32:
    uVar5 = player->cheats;
    bVar17 = (uVar5 >> 0x1e & 1) != 0;
    uVar3 = uVar5 ^ 0x40000000 | 1;
    if (bVar17) {
      uVar3 = uVar5 & 0xbffffffe;
    }
    pcVar16 = "STSTR_NCOFF";
    if (!bVar17) {
      pcVar16 = "STSTR_NC2ON";
    }
    player->cheats = uVar3;
    pcVar16 = FStringTable::operator()(&GStrings,pcVar16);
    dVar2 = (player->mo->super_AActor).Vel.X;
    if ((dVar2 == 0.0) && (!NAN(dVar2))) {
      (player->mo->super_AActor).Vel.X = 1.52587890625e-05;
    }
    break;
  case 0x33:
    uVar5 = player->cheats;
    player->cheats = uVar5 ^ 0x1000000;
    if ((uVar5 >> 0x18 & 1) == 0) {
      pcVar16 = "TXT_BUDDHA2ON";
    }
    else {
      pcVar16 = "TXT_BUDDHA2OFF";
    }
LAB_003b5c3e:
    pcVar16 = FStringTable::operator()(&GStrings,pcVar16);
    break;
  case 0x34:
    uVar5 = player->cheats;
    player->cheats = uVar5 ^ 0x2000000;
    pcVar16 = "STSTR_DQD2OFF";
    if ((uVar5 >> 0x19 & 1) == 0) {
      pcVar16 = "STSTR_DQD2ON";
    }
    goto LAB_003b5e56;
  }
  if (*pcVar16 != '\0') {
    if ((player_t *)(&players + (long)consoleplayer * 0x54) == player) {
      Printf("%s\n",pcVar16);
    }
    else if (cheat != 0x14) {
      pcVar7 = userinfo_t::GetName(&player->userinfo);
      Printf("%s cheats: %s\n",pcVar7,pcVar16);
    }
  }
  return;
}

Assistant:

void cht_DoCheat (player_t *player, int cheat)
{
	static const char * const BeholdPowers[9] =
	{
		"PowerInvulnerable",
		"PowerStrength",
		"PowerInvisibility",
		"PowerIronFeet",
		"MapRevealer",
		"PowerLightAmp",
		"PowerShadow",
		"PowerMask",
		"PowerTargeter",
	};
	PClassActor *type;
	AInventory *item;
	const char *msg = "";
	char msgbuild[32];
	int i;

	switch (cheat)
	{
	case CHT_IDDQD:
		if (!(player->cheats & CF_GODMODE) && player->playerstate == PST_LIVE)
		{
			if (player->mo)
				player->mo->health = deh.GodHealth;

			player->health = deh.GodHealth;
		}
		// fall through to CHT_GOD
	case CHT_GOD:
		player->cheats ^= CF_GODMODE;
		if (player->cheats & CF_GODMODE)
			msg = GStrings("STSTR_DQDON");
		else
			msg = GStrings("STSTR_DQDOFF");
		ST_SetNeedRefresh();
		break;

	case CHT_BUDDHA:
		player->cheats ^= CF_BUDDHA;
		if (player->cheats & CF_BUDDHA)
			msg = GStrings("TXT_BUDDHAON");
		else
			msg = GStrings("TXT_BUDDHAOFF");
		break;

	case CHT_GOD2:
		player->cheats ^= CF_GODMODE2;
		if (player->cheats & CF_GODMODE2)
			msg = GStrings("STSTR_DQD2ON");
		else
			msg = GStrings("STSTR_DQD2OFF");
		ST_SetNeedRefresh();
		break;

	case CHT_BUDDHA2:
		player->cheats ^= CF_BUDDHA2;
		if (player->cheats & CF_BUDDHA2)
			msg = GStrings("TXT_BUDDHA2ON");
		else
			msg = GStrings("TXT_BUDDHA2OFF");
		break;

	case CHT_NOCLIP:
		player->cheats ^= CF_NOCLIP;
		if (player->cheats & CF_NOCLIP)
			msg = GStrings("STSTR_NCON");
		else
			msg = GStrings("STSTR_NCOFF");
		break;

	case CHT_NOCLIP2:
		player->cheats ^= CF_NOCLIP2;
		if (player->cheats & CF_NOCLIP2)
		{
			player->cheats |= CF_NOCLIP;
			msg = GStrings("STSTR_NC2ON");
		}
		else
		{
			player->cheats &= ~CF_NOCLIP;
			msg = GStrings("STSTR_NCOFF");
		}
		if (player->mo->Vel.X == 0) player->mo->Vel.X = MinVel;	// force some lateral movement so that internal variables are up to date
		break;

	case CHT_NOVELOCITY:
		player->cheats ^= CF_NOVELOCITY;
		if (player->cheats & CF_NOVELOCITY)
			msg = GStrings("TXT_LEADBOOTSON");
		else
			msg = GStrings("TXT_LEADBOOTSOFF");
		break;

	case CHT_FLY:
		if (player->mo != NULL)
		{
			player->mo->flags7 ^= MF7_FLYCHEAT;
			if (player->mo->flags7 & MF7_FLYCHEAT)
			{
				player->mo->flags |= MF_NOGRAVITY;
				player->mo->flags2 |= MF2_FLY;
				msg = GStrings("TXT_LIGHTER");
			}
			else
			{
				player->mo->flags &= ~MF_NOGRAVITY;
				player->mo->flags2 &= ~MF2_FLY;
				msg = GStrings("TXT_GRAVITY");
			}
		}
		break;

	case CHT_MORPH:
		msg = cht_Morph (player, static_cast<PClassPlayerPawn *>(PClass::FindClass (gameinfo.gametype == GAME_Heretic ? NAME_ChickenPlayer : NAME_PigPlayer)), true);
		break;

	case CHT_NOTARGET:
		player->cheats ^= CF_NOTARGET;
		if (player->cheats & CF_NOTARGET)
			msg = "notarget ON";
		else
			msg = "notarget OFF";
		break;

	case CHT_ANUBIS:
		player->cheats ^= CF_FRIGHTENING;
		if (player->cheats & CF_FRIGHTENING)
			msg = "\"Quake with fear!\"";
		else
			msg = "No more ogre armor";
		break;

	case CHT_CHASECAM:
		player->cheats ^= CF_CHASECAM;
		if (player->cheats & CF_CHASECAM)
			msg = "chasecam ON";
		else
			msg = "chasecam OFF";
		R_ResetViewInterpolation ();
		break;

	case CHT_CHAINSAW:
		if (player->mo != NULL && player->health >= 0)
		{
			type = PClass::FindActor("Chainsaw");
			if (player->mo->FindInventory (type) == NULL)
			{
				player->mo->GiveInventoryType (type);
			}
			msg = GStrings("STSTR_CHOPPERS");
		}
		// [RH] The original cheat also set powers[pw_invulnerability] to true.
		// Since this is a timer and not a boolean, it effectively turned off
		// the invulnerability powerup, although it looks like it was meant to
		// turn it on.
		break;

	case CHT_POWER:
		if (player->mo != NULL && player->health >= 0)
		{
			item = player->mo->FindInventory (RUNTIME_CLASS(APowerWeaponLevel2), true);
			if (item != NULL)
			{
				item->Destroy ();
				msg = GStrings("TXT_CHEATPOWEROFF");
			}
			else
			{
				player->mo->GiveInventoryType (RUNTIME_CLASS(APowerWeaponLevel2));
				msg = GStrings("TXT_CHEATPOWERON");
			}
		}
		break;

	case CHT_IDKFA:
		cht_Give (player, "backpack");
		cht_Give (player, "weapons");
		cht_Give (player, "ammo");
		cht_Give (player, "keys");
		cht_Give (player, "armor");
		msg = GStrings("STSTR_KFAADDED");
		break;

	case CHT_IDFA:
		cht_Give (player, "backpack");
		cht_Give (player, "weapons");
		cht_Give (player, "ammo");
		cht_Give (player, "armor");
		msg = GStrings("STSTR_FAADDED");
		break;

	case CHT_BEHOLDV:
	case CHT_BEHOLDS:
	case CHT_BEHOLDI:
	case CHT_BEHOLDR:
	case CHT_BEHOLDA:
	case CHT_BEHOLDL:
	case CHT_PUMPUPI:
	case CHT_PUMPUPM:
	case CHT_PUMPUPT:
		i = cheat - CHT_BEHOLDV;

		if (i == 4)
		{
			level.flags2 ^= LEVEL2_ALLMAP;
		}
		else if (player->mo != NULL && player->health >= 0)
		{
			item = player->mo->FindInventory(PClass::FindActor(BeholdPowers[i]));
			if (item == NULL)
			{
				if (i != 0)
				{
					cht_Give(player, BeholdPowers[i]);
					if (cheat == CHT_BEHOLDS)
					{
						P_GiveBody (player->mo, -100);
					}
				}
				else
				{
					// Let's give the item here so that the power doesn't need colormap information.
					cht_Give(player, "InvulnerabilitySphere");
				}
			}
			else
			{
				item->Destroy ();
			}
		}
		msg = GStrings("STSTR_BEHOLDX");
		break;

	case CHT_MASSACRE:
		{
			int killcount = P_Massacre ();
			// killough 3/22/98: make more intelligent about plural
			// Ty 03/27/98 - string(s) *not* externalized
			mysnprintf (msgbuild, countof(msgbuild), "%d Monster%s Killed", killcount, killcount==1 ? "" : "s");
			msg = msgbuild;
		}
		break;

	case CHT_HEALTH:
		if (player->mo != NULL && player->playerstate == PST_LIVE)
		{
			player->health = player->mo->health = player->mo->GetDefault()->health;
			msg = GStrings("TXT_CHEATHEALTH");
		}
		break;

	case CHT_KEYS:
		cht_Give (player, "keys");
		msg = GStrings("TXT_CHEATKEYS");
		break;

	// [GRB]
	case CHT_RESSURECT:
		if (player->playerstate != PST_LIVE && player->mo != nullptr)
		{
			if (player->mo->IsKindOf(RUNTIME_CLASS(APlayerChunk)))
			{
				Printf("Unable to resurrect. Player is no longer connected to its body.\n");
			}
			else
			{
				player->playerstate = PST_LIVE;
				player->health = player->mo->health = player->mo->GetDefault()->health;
				player->viewheight = ((APlayerPawn *)player->mo->GetDefault())->ViewHeight;
				player->mo->flags = player->mo->GetDefault()->flags;
				player->mo->flags2 = player->mo->GetDefault()->flags2;
				player->mo->flags3 = player->mo->GetDefault()->flags3;
				player->mo->flags4 = player->mo->GetDefault()->flags4;
				player->mo->flags5 = player->mo->GetDefault()->flags5;
				player->mo->flags6 = player->mo->GetDefault()->flags6;
				player->mo->flags7 = player->mo->GetDefault()->flags7;
				player->mo->renderflags &= ~RF_INVISIBLE;
				player->mo->Height = player->mo->GetDefault()->Height;
				player->mo->radius = player->mo->GetDefault()->radius;
				player->mo->special1 = 0;	// required for the Hexen fighter's fist attack. 
											// This gets set by AActor::Die as flag for the wimpy death and must be reset here.
				player->mo->SetState (player->mo->SpawnState);
				if (!(player->mo->flags2 & MF2_DONTTRANSLATE))
				{
					player->mo->Translation = TRANSLATION(TRANSLATION_Players, BYTE(player-players));
				}
				player->mo->DamageType = NAME_None;
				if (player->ReadyWeapon != nullptr)
				{
					P_SetPsprite(player, PSP_WEAPON, player->ReadyWeapon->GetUpState());
				}

				if (player->morphTics)
				{
					P_UndoPlayerMorph(player, player);
				}

			}
		}
		break;

	case CHT_GIMMIEA:
		cht_Give (player, "ArtiInvulnerability");
		msg = "Valador's Ring of Invunerability";
		break;

	case CHT_GIMMIEB:
		cht_Give (player, "ArtiInvisibility");
		msg = "Shadowsphere";
		break;

	case CHT_GIMMIEC:
		cht_Give (player, "ArtiHealth");
		msg = "Quartz Flask";
		break;

	case CHT_GIMMIED:
		cht_Give (player, "ArtiSuperHealth");
		msg = "Mystic Urn";
		break;

	case CHT_GIMMIEE:
		cht_Give (player, "ArtiTomeOfPower");
		msg = "Tyketto's Tome of Power";
		break;

	case CHT_GIMMIEF:
		cht_Give (player, "ArtiTorch");
		msg = "Torch";
		break;

	case CHT_GIMMIEG:
		cht_Give (player, "ArtiTimeBomb");
		msg = "Delmintalintar's Time Bomb of the Ancients";
		break;

	case CHT_GIMMIEH:
		cht_Give (player, "ArtiEgg");
		msg = "Torpol's Morph Ovum";
		break;

	case CHT_GIMMIEI:
		cht_Give (player, "ArtiFly");
		msg = "Inhilicon's Wings of Wrath";
		break;

	case CHT_GIMMIEJ:
		cht_Give (player, "ArtiTeleport");
		msg = "Darchala's Chaos Device";
		break;

	case CHT_GIMMIEZ:
		for (int i=0;i<16;i++)
		{
			cht_Give (player, "artifacts");
		}
		msg = "All artifacts!";
		break;

	case CHT_TAKEWEAPS:
		if (player->morphTics || player->mo == NULL || player->mo->health <= 0)
		{
			return;
		}
		{
			// Take away all weapons that are either non-wimpy or use ammo.
			AInventory **invp = &player->mo->Inventory, **lastinvp;
			for (item = *invp; item != NULL; item = *invp)
			{
				lastinvp = invp;
				invp = &(*invp)->Inventory;
				if (item->IsKindOf (RUNTIME_CLASS(AWeapon)))
				{
					AWeapon *weap = static_cast<AWeapon *> (item);
					if (!(weap->WeaponFlags & WIF_WIMPY_WEAPON) ||
						weap->AmmoType1 != NULL)
					{
						item->Destroy ();
						invp = lastinvp;
					}
				}
			}
		}
		msg = GStrings("TXT_CHEATIDKFA");
		break;

	case CHT_NOWUDIE:
		cht_Suicide (player);
		msg = GStrings("TXT_CHEATIDDQD");
		break;

	case CHT_ALLARTI:
		for (int i=0;i<25;i++)
		{
			cht_Give (player, "artifacts");
		}
		msg = GStrings("TXT_CHEATARTIFACTS3");
		break;

	case CHT_PUZZLE:
		cht_Give (player, "puzzlepieces");
		msg = GStrings("TXT_CHEATARTIFACTS3");
		break;

	case CHT_MDK:
		if (player->mo == NULL)
		{
			Printf ("What do you want to kill outside of a game?\n");
		}
		else if (!deathmatch)
		{
			// Don't allow this in deathmatch even with cheats enabled, because it's
			// a very very cheap kill.
			P_LineAttack (player->mo, player->mo->Angles.Yaw, PLAYERMISSILERANGE,
				P_AimLineAttack (player->mo, player->mo->Angles.Yaw, PLAYERMISSILERANGE), TELEFRAG_DAMAGE,
				NAME_MDK, NAME_BulletPuff);
		}
		break;

	case CHT_DONNYTRUMP:
		cht_Give (player, "HealthTraining");
		msg = GStrings("TXT_MIDASTOUCH");
		break;

	case CHT_LEGO:
		if (player->mo != NULL && player->health >= 0)
		{
			static VMFunction *gsp = nullptr;
			if (gsp == nullptr) gsp = PClass::FindFunction(NAME_Sigil, NAME_GiveSigilPiece);
			if (gsp)
			{
				VMValue params[1] = { player->mo };
				VMReturn ret;
				int oldpieces = 1;
				ret.IntAt(&oldpieces);
				GlobalVMStack.Call(gsp, params, 1, &ret, 1, nullptr);
				item = player->mo->FindInventory(PClass::FindActor(NAME_Sigil));

				if (item != NULL)
				{
					if (oldpieces == 5)
					{
						item->Destroy();
					}
					else
					{
						player->PendingWeapon = static_cast<AWeapon *> (item);
					}
				}
			}
		}
		break;

	case CHT_PUMPUPH:
		cht_Give (player, "MedPatch");
		cht_Give (player, "MedicalKit");
		cht_Give (player, "SurgeryKit");
		msg = GStrings("TXT_GOTSTUFF");
		break;

	case CHT_PUMPUPP:
		cht_Give (player, "AmmoSatchel");
		msg = GStrings("TXT_GOTSTUFF");
		break;

	case CHT_PUMPUPS:
		cht_Give (player, "UpgradeStamina", 10);
		cht_Give (player, "UpgradeAccuracy");
		msg = GStrings("TXT_GOTSTUFF");
		break;

	case CHT_CLEARFROZENPROPS:
		player->cheats &= ~(CF_FROZEN|CF_TOTALLYFROZEN);
		msg = "Frozen player properties turned off";
		break;

	case CHT_FREEZE:
		bglobal.changefreeze ^= 1;
		if (bglobal.freeze ^ bglobal.changefreeze)
		{
			msg = GStrings("TXT_FREEZEON");
		}
		else
		{
			msg = GStrings("TXT_FREEZEOFF");
		}
		break;
	}

	if (!*msg)              // [SO] Don't print blank lines!
		return;

	if (player == &players[consoleplayer])
		Printf ("%s\n", msg);
	else if (cheat != CHT_CHASECAM)
		Printf ("%s cheats: %s\n", player->userinfo.GetName(), msg);
}